

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorShower::setRgb(QColorShower *this,QRgb rgb)

{
  QLineEdit *this_00;
  int *piVar1;
  long in_FS_OFFSET;
  QColor QStack_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = true;
  this->curCol = rgb;
  local_58.d.ptr._6_2_ = 0xaaaa;
  local_58.d.d._0_4_ = 0;
  local_58.d.d._4_2_ = 0xffff;
  local_58.d.d._6_2_ = 0;
  local_58.d.ptr._0_6_ = 0;
  QColor::setRgb((uint)&local_58);
  QColor::getHsv((int *)&local_58,&this->hue,&this->sat,&this->val);
  QColSpinBox::setValue(this->hEd,this->hue);
  QColSpinBox::setValue(this->sEd,this->sat);
  QColSpinBox::setValue(this->vEd,this->val);
  QColSpinBox::setValue(this->rEd,(uint)*(byte *)((long)&this->curCol + 2));
  QColSpinBox::setValue(this->gEd,(uint)*(byte *)((long)&this->curCol + 1));
  QColSpinBox::setValue(this->bEd,(uint)(byte)this->curCol);
  this_00 = this->htEd;
  QColor::QColor(&QStack_68,rgb);
  QColor::name((NameFormat)&local_58);
  QLineEdit::setText(this_00,&local_58);
  piVar1 = (int *)CONCAT26(local_58.d.d._6_2_,CONCAT24(local_58.d.d._4_2_,local_58.d.d._0_4_));
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT26(local_58.d.d._6_2_,CONCAT24(local_58.d.d._4_2_,local_58.d.d._0_4_)),2,0x10
                );
    }
  }
  showCurrentColor(this);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::setRgb(QRgb rgb)
{
    rgbOriginal = true;
    curCol = rgb;

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(QColor(rgb).name());

    showCurrentColor();
    updateQColor();
}